

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

void __thiscall
NJamSpell::TSpellCorrector::Inserts2(TSpellCorrector *this,wstring *w,TWords *result)

{
  bool bVar1;
  long lVar2;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *this_00;
  pointer this_01;
  NJamSpell local_f8 [32];
  wstring local_d8 [48];
  wstring local_a8 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68 [8];
  wstring s;
  value_type_conflict *ch;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *__range2;
  size_t i;
  TWords *result_local;
  wstring *w_local;
  TSpellCorrector *this_local;
  
  for (__range2 = (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                   *)0x0; lVar2 = std::__cxx11::wstring::size(),
      __range2 <
      (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
       *)(lVar2 + 1U);
      __range2 = (unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
                  *)((long)&(__range2->_M_h)._M_buckets + 1)) {
    this_00 = TLangModel::GetAlphabet(&this->LangModel);
    __end2 = std::
             unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
             ::begin(this_00);
    ch = (value_type_conflict *)
         std::
         unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
         ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<wchar_t,_false>,
                              (_Node_iterator_base<wchar_t,_false> *)&ch), bVar1) {
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator*(&__end2);
      std::__cxx11::wstring::substr((ulong)local_a8,(ulong)w);
      std::operator+(local_88,(wchar_t)local_a8);
      std::__cxx11::wstring::substr((ulong)local_d8,(ulong)w);
      std::operator+(local_68,local_88);
      std::__cxx11::wstring::~wstring(local_d8);
      std::__cxx11::wstring::~wstring((wstring *)local_88);
      std::__cxx11::wstring::~wstring(local_a8);
      this_01 = std::
                unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
                operator->(&this->Deletes1);
      WideToUTF8(local_f8,local_68);
      bVar1 = TBloomFilter::Contains(this_01,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      if (bVar1) {
        Inserts(this,local_68,result);
      }
      std::__cxx11::wstring::~wstring((wstring *)local_68);
      std::__detail::_Node_const_iterator<wchar_t,_true,_false>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts2(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            if (Deletes1->Contains(WideToUTF8(s))) {
                Inserts(s, result);
            }
        }
    }
}